

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_struct_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,size_t size,uint16_t align)

{
  int iVar1;
  flatbuffers_uoffset_t fVar2;
  flatbuffers_uoffset_t fVar3;
  void *p;
  flatbuffers_uoffset_t bufsiz;
  flatbuffers_uoffset_t *buf;
  uint16_t align_local;
  size_t size_local;
  char *fid_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  iVar1 = flatcc_verify_vector_field(td,id,required,(ulong)align,1,0xffffffff);
  if (iVar1 == 0) {
    p = get_field_ptr(td,id);
    if (p == (void *)0x0) {
      td_local._4_4_ = 0;
    }
    else {
      fVar2 = read_uoffset(p,0);
      fVar3 = read_uoffset((void *)((long)p + (ulong)fVar2),0);
      td_local._4_4_ =
           flatcc_verify_struct_as_root
                     ((void *)((long)((long)p + (ulong)fVar2) + 4),(ulong)fVar3,fid,size,align);
    }
  }
  else {
    td_local._4_4_ = flatcc_verify_vector_field(td,id,required,(ulong)align,1,0xffffffff);
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_struct_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid, size_t size, uint16_t align)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    return flatcc_verify_struct_as_root(buf, bufsiz, fid, size, align);
}